

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O3

void __thiscall cfd::core::Script::SetStackData(Script *this,ByteData *bytedata)

{
  undefined8 *puVar1;
  byte bVar2;
  undefined8 uVar3;
  bool bVar4;
  size_t sVar5;
  Script *__dest;
  int64_t value;
  _Base_ptr p_Var6;
  CfdException *pCVar7;
  ulong uVar8;
  long lVar9;
  _Base_ptr p_Var10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  Script *pSVar16;
  long lVar17;
  Script *this_00;
  uint uVar18;
  uint uVar19;
  size_type __new_size;
  size_t __n;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *this_01;
  pointer pSVar20;
  pointer pSVar21;
  allocator_type *int64_value;
  initializer_list<cfd::core::ScriptType> __l;
  initializer_list<cfd::core::ScriptType> __l_00;
  initializer_list<cfd::core::ScriptType> __l_01;
  vector<unsigned_char,_std::allocator<unsigned_char>_> collect_buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  ScriptElement script_element;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> top_collect_buffer;
  int64_t values [5];
  ByteData byte_array;
  undefined1 local_188 [48];
  pointer local_158;
  undefined1 local_148 [32];
  _Alloc_hider local_128;
  size_type sStack_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118 [3];
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  allocator_type local_b8 [40];
  ScriptElement local_90;
  
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_188 + 0x28),
                     bytedata);
  if ((SetStackData(cfd::core::ByteData_const&)::kUseScriptNum1 == '\0') &&
     (iVar12 = __cxa_guard_acquire(&SetStackData(cfd::core::ByteData_const&)::kUseScriptNum1),
     iVar12 != 0)) {
    local_148._16_8_ = (_func_int **)0x900000008f;
    local_148._24_8_ = 0x9200000091;
    local_148._0_8_ = (Script *)0xb1000000b2;
    local_148._8_8_ = 0x8c0000008b;
    local_128._M_p = (pointer)0x7a00000079;
    __l._M_len = 10;
    __l._M_array = (iterator)local_148;
    ::std::
    set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
    ::set(&SetStackData::kUseScriptNum1,__l,(less<cfd::core::ScriptType> *)&local_90,local_b8);
    __cxa_atexit(::std::
                 set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
                 ::~set,&SetStackData::kUseScriptNum1,&__dso_handle);
    __cxa_guard_release(&SetStackData(cfd::core::ByteData_const&)::kUseScriptNum1);
  }
  if ((SetStackData(cfd::core::ByteData_const&)::kUseScriptNum2 == '\0') &&
     (iVar12 = __cxa_guard_acquire(&SetStackData(cfd::core::ByteData_const&)::kUseScriptNum2),
     iVar12 != 0)) {
    local_128._M_p = (pointer)0xa10000009a;
    sStack_120 = 0xa4000000a3;
    local_148._16_8_ = (_func_int **)0x9d0000009c;
    local_148._24_8_ = 0x9f0000009e;
    local_148._0_8_ = (Script *)0x9400000093;
    local_148._8_8_ = 0x9b000000a0;
    local_118[0]._M_allocated_capacity._0_4_ = 0xa2;
    __l_00._M_len = 0xd;
    __l_00._M_array = (iterator)local_148;
    ::std::
    set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
    ::set(&SetStackData::kUseScriptNum2,__l_00,(less<cfd::core::ScriptType> *)&local_90,local_b8);
    __cxa_atexit(::std::
                 set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
                 ::~set,&SetStackData::kUseScriptNum2,&__dso_handle);
    __cxa_guard_release(&SetStackData(cfd::core::ByteData_const&)::kUseScriptNum2);
  }
  if ((SetStackData(cfd::core::ByteData_const&)::kUseScriptNum3 == '\0') &&
     (iVar12 = __cxa_guard_acquire(&SetStackData(cfd::core::ByteData_const&)::kUseScriptNum3),
     iVar12 != 0)) {
    local_148._0_8_ = (Script *)0xba000000a5;
    __l_01._M_len = 2;
    __l_01._M_array = (iterator)local_148;
    ::std::
    set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
    ::set(&SetStackData::kUseScriptNum3,__l_01,(less<cfd::core::ScriptType> *)&local_90,local_b8);
    __cxa_atexit(::std::
                 set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
                 ::~set,&SetStackData::kUseScriptNum3,&__dso_handle);
    __cxa_guard_release(&SetStackData(cfd::core::ByteData_const&)::kUseScriptNum3);
  }
  local_188._0_8_ = (_func_int **)0x0;
  local_188._8_8_ = (_func_int **)0x0;
  local_188._16_8_ = (pointer)0x0;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&local_e8,2,(allocator_type *)local_148);
  uVar8 = (long)local_158 - local_188._40_8_;
  if (uVar8 != 0) {
    this_01 = &this->script_stack_;
    uVar13 = 0;
    local_188._24_8_ = this_01;
    do {
      bVar2 = *(byte *)((long)(_func_int ***)local_188._40_8_ + uVar13);
      if (bVar2 == 0) {
        ScriptElement::ScriptElement
                  ((ScriptElement *)local_148,(ScriptOperator *)ScriptOperator::OP_0);
        ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
        push_back(this_01,(ScriptElement *)local_148);
        ScriptElement::~ScriptElement((ScriptElement *)local_148);
        uVar18 = 1;
        goto LAB_003086c5;
      }
      uVar14 = (uint)bVar2;
      iVar12 = (int)uVar13;
      if (bVar2 < 0x4c) {
        uVar13 = (ulong)(iVar12 + 1);
        __new_size = (size_type)uVar14;
LAB_00308424:
        if (local_188._8_8_ != local_188._0_8_) {
          local_188._8_8_ = local_188._0_8_;
        }
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_188,__new_size);
        if ((ulong)((long)local_158 - local_188._40_8_) <
            (ulong)(uint)((int)uVar13 + (int)__new_size)) {
          if ((((ulong)(((long)(this->script_stack_).
                               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->script_stack_).
                               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555
                       ) < 2) ||
              (sVar5 = ByteData::GetDataSize
                                 (local_e8.
                                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                  ._M_impl.super__Vector_impl_data._M_start), sVar5 != 3)) ||
             (sVar5 = ByteData::GetDataSize
                                (local_e8.
                                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1), pSVar20 = local_158
             , uVar3 = local_188._40_8_, sVar5 != 4)) {
            local_148._0_8_ = "cfdcore_script.cpp";
            local_148._8_4_ = 0x3c2;
            local_148._16_8_ = "SetStackData";
            logger::log<>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,
                          "buffer is incorrect size.");
            pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
            local_148._0_8_ = local_148 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_148,"buffer is incorrect size.","");
            CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_148);
            *(undefined ***)pCVar7 = &PTR__CfdException_0072e710;
            __cxa_throw(pCVar7,&InvalidScriptException::typeinfo,CfdException::~CfdException);
          }
          local_148._0_8_ = "cfdcore_script.cpp";
          local_148._8_4_ = 0x3c0;
          local_148._16_8_ = "SetStackData";
          logger::log<>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,
                        "This script is coinbase scriptsig?");
          __new_size = (size_type)(uint)(((int)pSVar20 - (int)uVar3) - (int)uVar13);
        }
        uVar18 = (uint)__new_size;
        lVar9 = (long)(_func_int ***)local_188._40_8_ + uVar13;
        this_00 = (Script *)local_188;
        ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,lVar9,
                   lVar9 + __new_size);
        uVar8 = ((long)local_e8.
                       super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_e8.
                       super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        lVar9 = (long)(this->script_stack_).
                      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->script_stack_).
                      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        if ((ulong)(lVar9 * -0x5555555555555555) <= uVar8 && uVar8 + lVar9 * 0x5555555555555555 != 0
           ) {
          ByteData::ByteData((ByteData *)local_148,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_188);
          lVar9 = (long)(this->script_stack_).
                        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->script_stack_).
                        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 2;
          this_00 = *(Script **)
                     ((long)&((local_e8.
                               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                               ._M_impl.super__Vector_impl_data._M_start)->data_).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar9);
          puVar1 = (undefined8 *)
                   ((long)&((local_e8.
                             super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                             ._M_impl.super__Vector_impl_data._M_start)->data_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start + lVar9);
          *puVar1 = local_148._0_8_;
          puVar1[1] = local_148._8_8_;
          *(undefined8 *)
           ((long)&((local_e8.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_start)->data_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + lVar9) = local_148._16_8_;
          local_148._0_8_ = (Script *)0x0;
          local_148._8_8_ = 0;
          local_148._16_8_ = (_func_int **)0x0;
          if ((this_00 != (Script *)0x0) &&
             (operator_delete(this_00), this_00 = (Script *)local_148._0_8_,
             (Script *)local_148._0_8_ != (Script *)0x0)) {
            operator_delete((void *)local_148._0_8_);
          }
        }
        if (uVar18 < 5) {
          pSVar16 = (Script *)(local_188._8_8_ - local_188._0_8_);
          if (pSVar16 == (Script *)0x0) {
            __dest = (Script *)0x0;
            __n = 0;
          }
          else {
            if ((long)pSVar16 < 0) {
              ::std::__throw_bad_alloc();
            }
            this_00 = pSVar16;
            __dest = (Script *)operator_new((ulong)pSVar16);
            __n = local_188._8_8_ - local_188._0_8_;
          }
          local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)&__dest->_vptr_Script + (long)&pSVar16->_vptr_Script);
          local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)__dest;
          if (local_188._8_8_ != local_188._0_8_) {
            this_00 = __dest;
            memmove(__dest,(void *)local_188._0_8_,__n);
          }
          local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)((long)&__dest->_vptr_Script + __n);
          value = ConvertToNumber(this_00,&local_d0);
          ScriptElement::ScriptElement((ScriptElement *)local_148,value,true);
          this_01 = (vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                    local_188._24_8_;
          if (__dest != (Script *)0x0) {
            operator_delete(__dest);
          }
          ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
          push_back(this_01,(ScriptElement *)local_148);
LAB_003086c0:
          ScriptElement::~ScriptElement((ScriptElement *)local_148);
        }
        else {
          ByteData::ByteData((ByteData *)&local_90,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_188);
          ScriptElement::ScriptElement((ScriptElement *)local_148,(ByteData *)&local_90);
          ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
          push_back(this_01,(ScriptElement *)local_148);
          ScriptElement::~ScriptElement((ScriptElement *)local_148);
          if (local_90._vptr_ScriptElement != (_func_int **)0x0) {
            operator_delete(local_90._vptr_ScriptElement);
          }
        }
      }
      else {
        uVar11 = (uint)bVar2;
        if (uVar11 == 0x4e) {
          uVar13 = (ulong)(iVar12 + 1) + 4;
          if (uVar8 <= uVar13) {
            local_148._0_8_ = "cfdcore_script.cpp";
            local_148._8_4_ = 0x372;
            local_148._16_8_ = "SetStackData";
            logger::log<>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,
                          "OP_PUSHDATA4 is incorrect size.");
            pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
            local_148._0_8_ = local_148 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_148,"OP_PUSHDATA4 is incorrect size.","");
            CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_148);
            *(undefined ***)pCVar7 = &PTR__CfdException_0072e710;
            __cxa_throw(pCVar7,&InvalidScriptException::typeinfo,CfdException::~CfdException);
          }
          __new_size = (size_type)
                       *(uint *)((long)(_func_int ***)local_188._40_8_ + (ulong)(iVar12 + 1));
LAB_00308421:
          uVar13 = uVar13 & 0xffffffff;
          goto LAB_00308424;
        }
        if (uVar11 == 0x4d) {
          uVar13 = (ulong)(iVar12 + 1) + 2;
          if (uVar8 <= uVar13) {
            local_148._0_8_ = "cfdcore_script.cpp";
            local_148._8_4_ = 0x365;
            local_148._16_8_ = "SetStackData";
            logger::log<>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,
                          "OP_PUSHDATA2 is incorrect size.");
            pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
            local_148._0_8_ = local_148 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_148,"OP_PUSHDATA2 is incorrect size.","");
            CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_148);
            *(undefined ***)pCVar7 = &PTR__CfdException_0072e710;
            __cxa_throw(pCVar7,&InvalidScriptException::typeinfo,CfdException::~CfdException);
          }
          __new_size = (size_type)
                       *(ushort *)((long)(_func_int ***)local_188._40_8_ + (ulong)(iVar12 + 1));
          goto LAB_00308421;
        }
        if (uVar11 == 0x4c) {
          uVar13 = (ulong)(iVar12 + 2);
          if (uVar8 <= uVar13) {
            local_148._0_8_ = "cfdcore_script.cpp";
            local_148._8_4_ = 0x35a;
            local_148._16_8_ = "SetStackData";
            logger::log<>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,
                          "OP_PUSHDATA1 is incorrect size.");
            pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
            local_148._0_8_ = local_148 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_148,"OP_PUSHDATA1 is incorrect size.","");
            CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_148);
            *(undefined ***)pCVar7 = &PTR__CfdException_0072e710;
            __cxa_throw(pCVar7,&InvalidScriptException::typeinfo,CfdException::~CfdException);
          }
          __new_size = (size_type)
                       *(byte *)((long)(_func_int ***)local_188._40_8_ + (ulong)(iVar12 + 1));
          goto LAB_00308421;
        }
        uVar19 = 1;
        uVar18 = 1;
        if (g_operator_map._16_8_ != 0 && g_operator_map._40_8_ != 0) {
          lVar17 = 0x758068;
          lVar9 = g_operator_map._16_8_;
          do {
            if ((int)uVar11 <= *(int *)(lVar9 + 0x20)) {
              lVar17 = lVar9;
            }
            lVar9 = *(long *)(lVar9 + 0x10 + (ulong)(*(int *)(lVar9 + 0x20) < (int)uVar11) * 8);
          } while (lVar9 != 0);
          if ((lVar17 == 0x758068) || ((int)uVar11 < *(int *)(lVar17 + 0x20))) goto LAB_003086c5;
          ScriptElement::ScriptElement((ScriptElement *)local_148,(ScriptOperator *)(lVar17 + 0x28))
          ;
          ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
          push_back(this_01,(ScriptElement *)local_148);
          uVar18 = uVar19;
          if (SetStackData::kUseScriptNum1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
              (_Base_ptr)0x0) {
LAB_0030878d:
            if (SetStackData::kUseScriptNum2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                != (_Base_ptr)0x0) {
              p_Var10 = &SetStackData::kUseScriptNum2._M_t._M_impl.super__Rb_tree_header._M_header;
              p_Var6 = SetStackData::kUseScriptNum2._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_parent;
              do {
                if ((int)uVar14 <= (int)p_Var6[1]._M_color) {
                  p_Var10 = p_Var6;
                }
                p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < (int)uVar14];
              } while (p_Var6 != (_Base_ptr)0x0);
              if (((_Rb_tree_header *)p_Var10 !=
                   &SetStackData::kUseScriptNum2._M_t._M_impl.super__Rb_tree_header) &&
                 ((int)p_Var10[1]._M_color <= (int)uVar14)) {
                uVar8 = ((long)(this->script_stack_).
                               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->script_stack_).
                               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555
                ;
                uVar11 = 2;
                uVar14 = uVar11;
                if (2 < uVar8) goto LAB_003088a6;
                goto LAB_003086c0;
              }
            }
            if (SetStackData::kUseScriptNum3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                != (_Base_ptr)0x0) {
              p_Var10 = &SetStackData::kUseScriptNum3._M_t._M_impl.super__Rb_tree_header._M_header;
              p_Var6 = SetStackData::kUseScriptNum3._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_parent;
              do {
                if ((int)uVar14 <= (int)p_Var6[1]._M_color) {
                  p_Var10 = p_Var6;
                }
                p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < (int)uVar14];
              } while (p_Var6 != (_Base_ptr)0x0);
              if (((_Rb_tree_header *)p_Var10 !=
                   &SetStackData::kUseScriptNum3._M_t._M_impl.super__Rb_tree_header) &&
                 ((int)p_Var10[1]._M_color <= (int)uVar14)) {
                uVar8 = ((long)(this->script_stack_).
                               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->script_stack_).
                               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555
                ;
                uVar11 = 3;
                uVar14 = uVar11;
                if (3 < uVar8) goto LAB_003088a6;
              }
            }
          }
          else {
            p_Var10 = &SetStackData::kUseScriptNum1._M_t._M_impl.super__Rb_tree_header._M_header;
            p_Var6 = SetStackData::kUseScriptNum1._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent;
            do {
              if ((int)uVar14 <= (int)p_Var6[1]._M_color) {
                p_Var10 = p_Var6;
              }
              p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < (int)uVar14];
            } while (p_Var6 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var10 ==
                 &SetStackData::kUseScriptNum1._M_t._M_impl.super__Rb_tree_header) ||
               ((int)uVar14 < (int)p_Var10[1]._M_color)) goto LAB_0030878d;
            uVar8 = ((long)(this->script_stack_).
                           super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->script_stack_).
                           super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
            if (1 < uVar8) {
              uVar11 = (uint)(1 < uVar8);
              uVar14 = 1;
LAB_003088a6:
              local_188._32_8_ = ZEXT48(uVar14);
              iVar12 = ~uVar11 + (int)uVar8;
              pSVar20 = (pointer)0x0;
              int64_value = local_b8;
              iVar15 = 0;
              do {
                bVar4 = ScriptElement::ConvertBinaryToNumber
                                  ((((_Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                      *)local_188._24_8_)->_M_impl).super__Vector_impl_data._M_start
                                   + (uint)(iVar12 + (int)pSVar20),(int64_t *)int64_value);
                iVar15 = iVar15 + (uint)bVar4;
                pSVar20 = (pointer)((long)&pSVar20->_vptr_ScriptElement + 1);
                int64_value = int64_value + 8;
              } while ((pointer)local_188._32_8_ != pSVar20);
              this_01 = (vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         *)local_188._24_8_;
              if (iVar15 == local_188._32_4_) {
                pSVar20 = (((_Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                             *)local_188._24_8_)->_M_impl).super__Vector_impl_data._M_start;
                pSVar21 = (pointer)0x0;
                do {
                  ScriptElement::ScriptElement(&local_90,*(int64_t *)(local_b8 + (long)pSVar21 * 8))
                  ;
                  ScriptElement::operator=(pSVar20 + (uint)(iVar12 + (int)pSVar21),&local_90);
                  ScriptElement::~ScriptElement(&local_90);
                  pSVar21 = (pointer)((long)&pSVar21->_vptr_ScriptElement + 1);
                  this_01 = (vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                             *)local_188._24_8_;
                } while ((pointer)local_188._32_8_ != pSVar21);
              }
            }
          }
          goto LAB_003086c0;
        }
      }
LAB_003086c5:
      uVar13 = (ulong)((int)uVar13 + uVar18);
      uVar8 = (long)local_158 - local_188._40_8_;
    } while (uVar13 < uVar8);
  }
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_e8);
  if ((_func_int **)local_188._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_188._0_8_);
  }
  if ((pointer)local_188._40_8_ != (pointer)0x0) {
    operator_delete((void *)local_188._40_8_);
  }
  return;
}

Assistant:

void Script::SetStackData(const ByteData& bytedata) {
  std::vector<uint8_t> buffer = bytedata.GetBytes();
  static const std::set<ScriptType> kUseScriptNum1{
      kOpCheckSequenceVerify,
      kOpCheckLockTimeVerify,
      kOp1Add,
      kOp1Sub,
      kOpNegate,
      kOpAbs,
      kOpNot,
      kOp0NotEqual,
      kOpPick,
      kOpRoll};
  static const std::set<ScriptType> kUseScriptNum2{
      kOpAdd,
      kOpSub,
      kOpGreaterThan,
      kOpBoolOr,
      kOpNumEqual,
      kOpNumEqualVerify,
      kOpNumNotEqual,
      kOpLessThan,
      kOpBoolAnd,
      kOpLessThanOrEqual,
      kOpMin,
      kOpMax,
      kOpGreaterThanOrEqual};
  static const std::set<ScriptType> kUseScriptNum3{kOpWithIn, kOpCheckSigAdd};

  // create stack
  bool is_collect_buffer = false;
  uint32_t collect_buffer_size = 0;
  std::vector<uint8_t> collect_buffer;
  std::vector<ByteData> top_collect_buffer(2);
  uint32_t offset = 0;
  while (offset < buffer.size()) {
    uint8_t view_data = buffer[offset];
    if (kOp_0 == view_data) {
      // @formatter:off
      ScriptElement script_element = ScriptElement(ScriptOperator::OP_0);
      // @formatter:on
      script_stack_.push_back(script_element);

    } else if (view_data < kOpPushData1) {
      collect_buffer_size = view_data;
      is_collect_buffer = true;
      ++offset;

    } else if (view_data == kOpPushData1) {
      ++offset;
      if ((offset + 1) >= buffer.size()) {
        warn(CFD_LOG_SOURCE, "OP_PUSHDATA1 is incorrect size.");
        throw InvalidScriptException("OP_PUSHDATA1 is incorrect size.");
      }
      collect_buffer_size = buffer[offset];
      is_collect_buffer = true;
      ++offset;

    } else if (view_data == kOpPushData2) {
      ++offset;
      uint16_t ushort_value = 0;
      if ((offset + sizeof(uint16_t)) >= buffer.size()) {
        warn(CFD_LOG_SOURCE, "OP_PUSHDATA2 is incorrect size.");
        throw InvalidScriptException("OP_PUSHDATA2 is incorrect size.");
      }
      // process under LittleEndian
      memcpy(&ushort_value, &buffer[offset], sizeof(ushort_value));
      collect_buffer_size = ushort_value;
      offset += sizeof(ushort_value);
      is_collect_buffer = true;

    } else if (view_data == kOpPushData4) {
      ++offset;
      uint32_t uint_value = 0;
      if ((offset + sizeof(uint_value)) >= buffer.size()) {
        warn(CFD_LOG_SOURCE, "OP_PUSHDATA4 is incorrect size.");
        throw InvalidScriptException("OP_PUSHDATA4 is incorrect size.");
      }
      // process under LittleEndian
      memcpy(&uint_value, &buffer[offset], sizeof(uint_value));
      collect_buffer_size = uint_value;
      offset += sizeof(uint_value);
      is_collect_buffer = true;

    } else {
      // if ((bytedata == OP_0) || ((byteadata >= OP_PUSHDATA1)
      //     && (byteadata <= OP_NOP10)))
      // TODO(k-matsuzawa): Considering script extension, do not perform strict check of OP value.  // NOLINT

      // Setting for ScriptOperator
      ScriptType type = (ScriptType)view_data;
      if (!g_operator_map.empty()) {
        decltype(g_operator_map)::const_iterator ite =
            g_operator_map.find(type);
        if (ite != g_operator_map.end()) {
          ScriptElement script_element = ScriptElement(ite->second);
          script_stack_.push_back(script_element);

          // Since bytedata is stored as numerica type, after decoding bytedata
          // Re-convert to numeric type based on the contents of OP_CODE.
          /// Since OP_CHECKMULTISIG and OP_CHECKMULTISIGVERIFY are
          // in the range of OP_1-OP_16, they are excluded from
          // this conversion process.
          uint32_t convert_count = 0;
          if (kUseScriptNum1.count(type) > 0) {
            if (script_stack_.size() > 1) {
              convert_count = 1;
            }
          } else if (kUseScriptNum2.count(type) > 0) {
            if (script_stack_.size() > 2) {
              convert_count = 2;
            }
          } else if (kUseScriptNum3.count(type) > 0) {
            if (script_stack_.size() > 3) {
              convert_count = 3;
            }
          }

          static constexpr uint32_t kMaxArray = 5;
          if ((convert_count != 0) && (convert_count <= kMaxArray)) {
            int64_t values[kMaxArray];
            uint32_t stack_offset =
                static_cast<uint32_t>(script_stack_.size());
            stack_offset -= convert_count + 1;
            uint32_t check_count = 0;
            for (uint32_t index = 0; index < convert_count; ++index) {
              if (script_stack_[stack_offset + index].ConvertBinaryToNumber(
                      &values[index])) {
                ++check_count;
              }
            }
            if (check_count == convert_count) {
              ScriptElement* pointer = script_stack_.data();
              for (uint32_t index = 0; index < convert_count; ++index) {
                pointer[stack_offset + index] = ScriptElement(values[index]);
              }
            }
          }
        }
      }
    }

    if (is_collect_buffer) {
      collect_buffer.clear();
      collect_buffer.resize(collect_buffer_size);
      auto tmp_collect_buffer_size = collect_buffer_size;
      if ((offset + collect_buffer_size) > buffer.size()) {
        if ((script_stack_.size() >= 2) &&
            (top_collect_buffer[0].GetDataSize() == 3) &&
            (top_collect_buffer[1].GetDataSize() == 4)) {
          // (push past end) If script is coinbase scriptsig, length is low.
          tmp_collect_buffer_size =
              static_cast<uint32_t>(buffer.size()) - offset;
          warn(CFD_LOG_SOURCE, "This script is coinbase scriptsig?");
        } else {
          warn(CFD_LOG_SOURCE, "buffer is incorrect size.");
          throw InvalidScriptException("buffer is incorrect size.");
        }
      }

      // OK
      collect_buffer.assign(
          buffer.begin() + offset,
          buffer.begin() + offset + tmp_collect_buffer_size);

      if (top_collect_buffer.size() > script_stack_.size()) {
        // for coinbase script check
        top_collect_buffer[script_stack_.size()] = ByteData(collect_buffer);
      }
      if (tmp_collect_buffer_size <= kMaxScriptNumSize) {
        ScriptElement script_element =
            ScriptElement(ConvertToNumber(collect_buffer), true);
        script_stack_.push_back(script_element);
      } else {
        ByteData byte_array = ByteData(collect_buffer);
        ScriptElement script_element = ScriptElement(byte_array);
        script_stack_.push_back(script_element);
      }
      offset += tmp_collect_buffer_size;
      is_collect_buffer = false;
    } else {
      ++offset;
    }
  }
  if (is_collect_buffer) {
    // incorrect script
    warn(CFD_LOG_SOURCE, "incorrect script data.");
    throw InvalidScriptException("incorrect script data.");
  }
}